

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O0

void __thiscall ChatWindow::attemptConnection(ChatWindow *this)

{
  ChatClient *this_00;
  bool bVar1;
  undefined4 in_stack_ffffffffffffff04;
  QHostAddress local_c8 [12];
  uint local_bc;
  QFlags<Qt::InputMethodHint> local_b8;
  QFlags<Qt::WindowType> local_b4;
  QArrayDataPointer<char16_t> local_b0;
  QString local_98;
  QString local_70;
  QString local_58;
  undefined1 local_40 [8];
  QString hostAddress;
  ChatWindow *this_local;
  char16_t *str;
  
  hostAddress.d.size = (qsizetype)this;
  tr(&local_58,"Chose Server",(char *)0x0,-1);
  tr(&local_70,"Server Address",(char *)0x0,-1);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_b0,(Data *)0x0,L"127.0.0.1",9);
  QString::QString(&local_98,&local_b0);
  QFlags<Qt::WindowType>::QFlags(&local_b4);
  QFlags<Qt::InputMethodHint>::QFlags(&local_b8,ImhNone);
  QInputDialog::getText
            ((QWidget *)local_40,(QString *)this,(QString *)&local_58,(EchoMode)&local_70,
             (QString *)0x0,(bool *)&local_98,(QFlags_conflict1 *)0x0,
             (QFlags_conflict1 *)CONCAT44(in_stack_ffffffffffffff04,local_b4.i));
  QString::~QString(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QString::~QString(&local_70);
  QString::~QString(&local_58);
  bVar1 = QString::isEmpty((QString *)local_40);
  if (!bVar1) {
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 8),0));
    this_00 = this->m_chatClient;
    QHostAddress::QHostAddress(local_c8,(QString *)local_40);
    ChatClient::connectToServer(this_00,local_c8,0x7af);
    QHostAddress::~QHostAddress(local_c8);
  }
  local_bc = (uint)bVar1;
  QString::~QString((QString *)local_40);
  return;
}

Assistant:

void ChatWindow::attemptConnection()
{
    // We ask the user for the address of the server, we use 127.0.0.1 (aka localhost) as default
    const QString hostAddress = QInputDialog::getText(
        this
        , tr("Chose Server")
        , tr("Server Address")
        , QLineEdit::Normal
        , QStringLiteral("127.0.0.1")
    );
    if (hostAddress.isEmpty())
        return; // the user pressed cancel or typed nothing
    // disable the connect button to prevent the user clicking it again
    ui->connectButton->setEnabled(false);
    // tell the client to connect to the host using the port 1967
    m_chatClient->connectToServer(QHostAddress(hostAddress), 1967);
}